

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall TSparseArray::LoadFromStream(TSparseArray *this,TByteStream *InStream)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  int iVar5;
  
  iVar5 = TGenericArray<unsigned_int>::LoadFromStream(&this->ItemBits,InStream);
  if (iVar5 == 0) {
    uVar3 = InStream->cbByteData;
    iVar5 = 1000;
    if (3 < uVar3) {
      puVar4 = (uint *)InStream->pbByteData;
      InStream->pbByteData = (LPBYTE)(puVar4 + 1);
      InStream->cbByteData = uVar3 - 4;
      if (3 < uVar3 - 4) {
        uVar1 = *puVar4;
        InStream->pbByteData = (LPBYTE)(puVar4 + 2);
        InStream->cbByteData = uVar3 - 8;
        uVar2 = puVar4[1];
        iVar5 = 0x3ec;
        if (uVar2 <= uVar1) {
          this->TotalItemCount = (ulong)uVar1;
          this->ValidItemCount = (ulong)uVar2;
          iVar5 = TGenericArray<_BASEVALS>::LoadFromStream(&this->BaseVals,InStream);
          if (iVar5 == 0) {
            iVar5 = TGenericArray<unsigned_int>::LoadFromStream(&this->IndexToItem0,InStream);
            if (iVar5 == 0) {
              iVar5 = TGenericArray<unsigned_int>::LoadFromStream(&this->IndexToItem1,InStream);
              return iVar5;
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD total_count = 0;
        DWORD valid_count = 0;
        int nError;

        nError = ItemBits.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.GetValue<DWORD>(total_count);
        if(nError != ERROR_SUCCESS)
            return nError;
        nError = InStream.GetValue<DWORD>(valid_count);
        if(nError != ERROR_SUCCESS)
            return nError;
        if(valid_count > total_count)
            return ERROR_FILE_CORRUPT;

        TotalItemCount = total_count;
        ValidItemCount = valid_count;

        nError = BaseVals.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = IndexToItem0.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = IndexToItem1.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        return ERROR_SUCCESS;
    }